

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>::
SetPropertyWithAttributes
          (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this,
          DynamicObject *instance,PropertyId propertyId,Var value,PropertyAttributes attributes,
          PropertyValueInfo *info,PropertyOperationFlags flags,SideEffects possibleSideEffects)

{
  int *piVar1;
  byte bVar2;
  Type *pTVar3;
  RecyclerWeakReference<Js::DynamicObject> *pRVar4;
  JavascriptLibrary *pJVar5;
  code *pcVar6;
  PropertyRecord *this_00;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_01;
  uint uVar7;
  bool bVar8;
  uint32 index;
  int iVar9;
  BOOL BVar10;
  PropertyId propertyId_00;
  undefined4 *puVar11;
  PropertyRecord **ppPVar12;
  DictionaryTypeHandlerBase<int> *pDVar13;
  SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this_02;
  undefined7 in_register_00000081;
  DynamicObject *pDVar14;
  PropertyRecord *local_60;
  PropertyRecord *propertyRecord;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *local_50;
  int i;
  SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *local_40;
  SimpleDictionaryPropertyDescriptor<int> *local_38;
  SimpleDictionaryPropertyDescriptor<int> *descriptor;
  
  local_40 = (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *)
             CONCAT44(local_40._4_4_,(int)CONCAT71(in_register_00000081,attributes));
  _i = info;
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x92a,"(instance)","instance");
    if (!bVar8) goto LAB_00dec4a1;
    *puVar11 = 0;
  }
  propertyRecord =
       (PropertyRecord *)
       (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x92f,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar8) goto LAB_00dec4a1;
    *puVar11 = 0;
  }
  local_60 = ScriptContext::GetPropertyName
                       ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                        super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
  bVar8 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_60,&local_38,(int *)&local_50);
  bVar2 = (byte)local_40;
  if (!bVar8) {
    if (local_60->isNumeric != true) {
      BVar10 = SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false>::
               AddProperty<Js::PropertyRecord_const*>
                         ((SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false> *)
                          this,instance,local_60,value,(byte)local_40,_i,flags,possibleSideEffects);
      return BVar10;
    }
    index = PropertyRecord::GetNumericValue(local_60);
    BVar10 = DynamicTypeHandler::SetItemWithAttributes
                       (&this->super_DynamicTypeHandler,instance,index,value,(byte)local_40);
    return BVar10;
  }
  uVar7 = (uint)local_40;
  if ((local_38->Attributes & 0x10) != (bVar2 & 0x10)) {
    pDVar13 = SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false>::
              ConvertToTypeHandler<Js::DictionaryTypeHandlerBase<int>,Js::PropertyRecord_const*>
                        ((SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false> *)
                         this,instance);
    piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr)->
              convertSimpleDictionaryToDictionaryCount;
    *piVar1 = *piVar1 + 1;
    iVar9 = (*(pDVar13->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x3a])
                      (pDVar13,instance,(ulong)(uint)propertyId,value,(ulong)(uVar7 & 0xff),_i,
                       (ulong)flags,possibleSideEffects);
    return iVar9;
  }
  if ((local_38->Attributes & 0x18) == 8) {
    bVar2 = (this->super_DynamicTypeHandler).flags;
    if ((bVar2 & 4) == 0) {
      pTVar3 = (instance->super_RecyclableObject).type.ptr;
      if (*(char *)&pTVar3[1].javascriptLibrary.ptr == '\x01') {
        if (((bVar2 & 0x10) != 0) ||
           (*(char *)((long)&pTVar3[1].javascriptLibrary.ptr + 1) == '\x01')) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar11 = 1;
          bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0x960,
                                      "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())"
                                      ,
                                      "!GetIsShared() && !instance->GetDynamicType()->GetIsShared()"
                                     );
          if (!bVar8) goto LAB_00dec4a1;
          *puVar11 = 0;
        }
        DynamicObject::ChangeType(instance);
      }
      if (((this->field_0x28 & 2) != 0) &&
         (bVar8 = SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false>::
                  TryUndeleteProperty((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false>
                                       *)this,instance,local_38->propertyIndex,(int *)&local_50),
         bVar8)) {
        ppPVar12 = JsUtil::
                   BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                   ::GetKeyAt((this->propertyMap).ptr,(int)local_50);
        if (*ppPVar12 != local_60) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar11 = 1;
          bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0x96b,
                                      "(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), propertyRecord))"
                                      ,
                                      "PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), propertyRecord)"
                                     );
          if (!bVar8) goto LAB_00dec4a1;
          *puVar11 = 0;
        }
        local_38 = JsUtil::
                   BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                   ::GetReferenceAt((this->propertyMap).ptr,(int)local_50);
      }
      bVar8 = SupportsSwitchingToUnordered(this,(ScriptContext *)propertyRecord);
      if (bVar8) {
        this->numDeletedProperties = this->numDeletedProperties + 0xff;
      }
      ScriptContext::InvalidateProtoCaches((ScriptContext *)propertyRecord,propertyId);
      local_38->Attributes = '\a';
      bVar2 = (byte)local_40;
      goto LAB_00debfb4;
    }
LAB_00dec11a:
    this_02 = ConvertToNonSharedSimpleDictionaryType(this,instance);
    BVar10 = SetPropertyWithAttributes
                       (this_02,instance,propertyId,value,(byte)local_40,_i,flags,
                        possibleSideEffects);
  }
  else {
LAB_00debfb4:
    if (local_38->Attributes != bVar2) {
      bVar2 = (this->super_DynamicTypeHandler).flags;
      if ((bVar2 & 4) != 0) goto LAB_00dec11a;
      pTVar3 = (instance->super_RecyclableObject).type.ptr;
      if (*(char *)&pTVar3[1].javascriptLibrary.ptr == '\x01') {
        if (((bVar2 & 0x10) != 0) ||
           (*(char *)((long)&pTVar3[1].javascriptLibrary.ptr + 1) == '\x01')) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar11 = 1;
          bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0x997,
                                      "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())"
                                      ,
                                      "!GetIsShared() && !instance->GetDynamicType()->GetIsShared()"
                                     );
          if (!bVar8) goto LAB_00dec4a1;
          *puVar11 = 0;
        }
        DynamicObject::ChangeType(instance);
      }
      local_38->Attributes = (PropertyAttributes)local_40;
    }
    if (local_38->propertyIndex != -1) {
      pRVar4 = (this->singletonInstance).ptr;
      if (pRVar4 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
        pDVar14 = (DynamicObject *)0x0;
      }
      else {
        pDVar14 = (DynamicObject *)(pRVar4->super_RecyclerWeakReferenceBase).strongRef;
      }
      if (pDVar14 != instance && pRVar4 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
        AssertCount = AssertCount + 1;
        local_40 = this;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x9a5,
                                    "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                    ,
                                    "this->singletonInstance == nullptr || localSingletonInstance == instance"
                                   );
        if (!bVar8) goto LAB_00dec4a1;
        *puVar11 = 0;
        this = local_40;
      }
      if ((*(byte *)local_38 & 2) == 0) {
        if ((((flags & PropertyOperation_PreInit) == PropertyOperation_None) &&
            (*(byte *)local_38 = *(byte *)local_38 | 2, pDVar14 == instance)) &&
           ((flags & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
            PropertyOperation_None && 0xf < (uint)propertyId)) {
          if (((this->super_DynamicTypeHandler).flags & 0x10) != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar11 = 1;
            bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                        ,0x9af,"(!GetIsShared())","!GetIsShared()");
            if (!bVar8) goto LAB_00dec4a1;
            *puVar11 = 0;
          }
          if (value == (Var)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar11 = 1;
            bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                        ,0x9b0,"(value != nullptr)","value != nullptr");
            if (!bVar8) goto LAB_00dec4a1;
            *puVar11 = 0;
          }
          BVar10 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
          if (BVar10 != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar11 = 1;
            bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                        ,0x9b2,"(!instance->IsExternal())","!instance->IsExternal()"
                                       );
            if (!bVar8) {
LAB_00dec4a1:
              pcVar6 = (code *)invalidInstructionException();
              (*pcVar6)();
            }
            *puVar11 = 0;
          }
          bVar8 = VarIs<Js::JavascriptFunction>(value);
          if (bVar8) {
            bVar8 = Phases::IsEnabled((Phases *)&DAT_015bbe90,FixMethodPropsPhase);
            bVar8 = !bVar8;
          }
          else {
            bVar8 = Phases::IsEnabled((Phases *)&DAT_015bbe90,FixDataPropsPhase);
            if (bVar8) {
              bVar8 = false;
            }
            else {
              bVar8 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps
                                (instance,propertyId,value);
            }
          }
          *(byte *)local_38 = *(byte *)local_38 & 0xfb | bVar8 << 2;
        }
      }
      else {
        SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false>::
        InvalidateFixedField<Js::PropertyRecord_const*>
                  ((SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false> *)this,
                   local_60,local_38,
                   (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                   super_JavascriptLibraryBase).scriptContext.ptr);
      }
      DynamicTypeHandler::SetSlotUnchecked(instance,local_38->propertyIndex,value);
      if (_i != (PropertyValueInfo *)0x0) {
        _i->m_instance = &instance->super_RecyclableObject;
        _i->m_propertyIndex = 0xffff;
        _i->m_attributes = '\0';
        _i->flags = InlineCacheNoFlags;
      }
    }
    if ((local_38->Attributes & 1) != 0) {
      DynamicObject::SetHasNoEnumerableProperties(instance,false);
    }
    pJVar5 = (((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
    Memory::Recycler::WBSetBit((char *)&local_50);
    local_50 = &pJVar5->typesWithOnlyWritablePropertyProtoChain;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_50);
    this_01 = local_50;
    if (((local_38->Attributes & 4) == 0) &&
       (DynamicTypeHandler::SetHasOnlyWritableDataProperties(&this->super_DynamicTypeHandler,false),
       this_00 = propertyRecord, ((this->super_DynamicTypeHandler).flags & 0x20) != 0)) {
      propertyId_00 =
           DynamicTypeHandler::TMapKey_GetPropertyId((ScriptContext *)propertyRecord,propertyId);
      ScriptContext::InvalidateStoreFieldCaches((ScriptContext *)this_00,propertyId_00);
      PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(this_01);
    }
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              (&this->super_DynamicTypeHandler,instance,propertyId,value,possibleSideEffects);
    BVar10 = 1;
  }
  return BVar10;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetPropertyWithAttributes(DynamicObject* instance, PropertyId propertyId, Var value, PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        AnalysisAssert(instance);
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        ScriptContext* scriptContext = instance->GetScriptContext();
        bool throwIfNotExtensible = (flags & PropertyOperation_ThrowIfNotExtensible) != 0;

        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            if ((attributes & PropertyLetConstGlobal) != (descriptor->Attributes & PropertyLetConstGlobal))
            {
                // We have a shadowing case here.  Either a let/const is being declared
                // that shadows an undeclared global property or an undeclared global
                // property is being added after a let/const was already declared.
                //
                // SimpleDictionaryTypeHandlerBase does not handle shadowed globals
                // because we do not want to add another property index field to the
                // property descriptors.  Instead convert to DictionaryTypeHandler
                // where it will reuse one of the getter/setter fields on its
                // property descriptor type.
                //
                // An exception is in the language service that will sometimes execute
                // the glo function twice causing a const or let appear to shadow itself.
                // In this case setting the property is also right.
                return
                    ConvertToDictionaryType(instance)
                        ->SetPropertyWithAttributes(
                                instance,
                                propertyId,
                                value,
                                attributes,
                                info,
                                flags,
                                possibleSideEffects);
            }

            if (descriptor->Attributes & PropertyDeleted && !(descriptor->Attributes & PropertyLetConstGlobal))
            {
                Assert((descriptor->Attributes & PropertyLetConstGlobal) == 0);
                if(GetIsLocked())
                {
                    return
                        ConvertToNonSharedSimpleDictionaryType(instance)
                            ->SetPropertyWithAttributes(
                                instance,
                                propertyId,
                                value,
                                attributes,
                                info,
                                flags,
                                possibleSideEffects);
                }
                else if (instance->GetDynamicType()->GetIsLocked())
                {
                    Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                    // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                    instance->ChangeType();
                }

                if(isUnordered)
                {
                    TPropertyIndex propertyIndex;
                    if(AsUnordered()->TryUndeleteProperty(instance, descriptor->propertyIndex, &propertyIndex))
                    {
                        Assert(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), propertyRecord));
                        descriptor = propertyMap->GetReferenceAt(propertyIndex);
                    }
                }

                if (IsNotExtensibleSupported)
                {
                    bool isForce = (flags & PropertyOperation_Force) != 0;
                    if (!isForce)
                    {
                        if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
                        {
                            return FALSE;
                        }
                    }
                }

                if(SupportsSwitchingToUnordered(scriptContext))
                {
                    --numDeletedProperties;
                }
                scriptContext->InvalidateProtoCaches(propertyId);
                descriptor->Attributes = PropertyDynamicTypeDefaults;
            }

            if (descriptor->Attributes != attributes)
            {
                if (GetIsLocked())
                {
                    return
                        ConvertToNonSharedSimpleDictionaryType(instance)
                            ->SetPropertyWithAttributes(
                                instance,
                                propertyId,
                                value,
                                attributes,
                                info,
                                flags,
                                possibleSideEffects);
                }
                else
                {
                    if (instance->GetDynamicType()->GetIsLocked())
                    {
                        Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                        // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                        instance->ChangeType();
                    }

                    descriptor->Attributes = attributes;
                }
            }

            if (descriptor->propertyIndex != NoSlots)
            {
#if ENABLE_FIXED_FIELDS
                DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
                Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);
                if (!descriptor->isInitialized)
                {
                    if ((flags & PropertyOperation_PreInit) == 0)
                    {
                        // Consider: It would be nice to assert the slot is actually null.  However, we sometimes pre-initialize to undefined or even
                        // some other special illegal value (for let or const), currently == null.
                        descriptor->isInitialized = true;
                        if (localSingletonInstance == instance && !IsInternalPropertyId(propertyId) && (flags & (PropertyOperation_SpecialValue | PropertyOperation_NonFixedValue)) == 0)
                        {
                            Assert(!GetIsShared());
                            Assert(value != nullptr);
                            // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                            Assert(!instance->IsExternal());
                            descriptor->isFixed = (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyId, value)));
                        }
                    }
                }
                else
                {
                    InvalidateFixedField(propertyRecord, descriptor, instance->GetScriptContext());
                }
#endif
                SetSlotUnchecked(instance, descriptor->propertyIndex, value);

                if (!descriptor->IsOrMayBecomeFixed())
                {
                    SetPropertyValueInfoNonFixed(info, instance, descriptor->propertyIndex, descriptor->Attributes);
                }
                else
                {
                    PropertyValueInfo::SetNoCache(info, instance);
                }
            }

            if (descriptor->Attributes & PropertyEnumerable)
            {
                instance->SetHasNoEnumerableProperties(false);
            }

            instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, descriptor->Attributes, propertyId, scriptContext);

            SetPropertyUpdateSideEffect(instance, propertyId, value, possibleSideEffects);
            return true;
        }

        // Always check numeric propertyRecord. May create objectArray.
        if (propertyRecord->IsNumeric())
        {
            return SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetItemWithAttributes(instance, propertyRecord->GetNumericValue(), value, attributes);
        }

        return this->AddProperty(instance, propertyRecord, value, attributes, info, flags, possibleSideEffects);
    }